

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaTypePtr
xmlSchemaParseExtension
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,
          xmlSchemaTypeType parentType)

{
  xmlNodePtr annItem;
  int iVar1;
  xmlSchemaAnnotPtr annot;
  _xmlNode *p_Var2;
  xmlSchemaWildcardPtr pxVar3;
  xmlAttrPtr local_48;
  xmlAttrPtr attr;
  xmlNodePtr child;
  xmlSchemaTypePtr type;
  xmlNodePtr pxStack_28;
  xmlSchemaTypeType parentType_local;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  attr = (xmlAttrPtr)0x0;
  if (((ctxt != (xmlSchemaParserCtxtPtr)0x0) && (schema != (xmlSchemaPtr)0x0)) &&
     (node != (xmlNodePtr)0x0)) {
    child = (xmlNodePtr)ctxt->ctxtType;
    ((xmlSchemaTypePtr)child)->flags = ((xmlSchemaTypePtr)child)->flags | 2;
    type._4_4_ = parentType;
    pxStack_28 = node;
    node_local = (xmlNodePtr)schema;
    schema_local = (xmlSchemaPtr)ctxt;
    for (local_48 = node->properties; local_48 != (xmlAttrPtr)0x0; local_48 = local_48->next) {
      if (local_48->ns == (xmlNs *)0x0) {
        iVar1 = xmlStrEqual(local_48->name,"id");
        if ((iVar1 == 0) && (iVar1 = xmlStrEqual(local_48->name,"base"), iVar1 == 0)) {
          xmlSchemaPIllegalAttrErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                     (xmlSchemaBasicItemPtr)0x0,local_48);
        }
      }
      else {
        iVar1 = xmlStrEqual(local_48->ns->href,xmlSchemaNs);
        if (iVar1 != 0) {
          xmlSchemaPIllegalAttrErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                     (xmlSchemaBasicItemPtr)0x0,local_48);
        }
      }
    }
    xmlSchemaPValAttrID((xmlSchemaParserCtxtPtr)schema_local,pxStack_28,"id");
    iVar1 = xmlSchemaPValAttrQName
                      ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                       (xmlSchemaBasicItemPtr)0x0,pxStack_28,"base",(xmlChar **)&child->psvi,
                       (xmlChar **)&child->nsDef);
    if ((iVar1 == 0) && (child->nsDef == (xmlNs *)0x0)) {
      xmlSchemaPMissingAttrErr
                ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_MISSING,
                 (xmlSchemaBasicItemPtr)0x0,pxStack_28,"base",(char *)0x0);
    }
    attr = (xmlAttrPtr)pxStack_28->children;
    if (((((_xmlNode *)attr != (_xmlNode *)0x0) && (((_xmlNode *)attr)->ns != (xmlNs *)0x0)) &&
        (iVar1 = xmlStrEqual(((_xmlNode *)attr)->name,(xmlChar *)"annotation"), iVar1 != 0)) &&
       (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), annItem = child, iVar1 != 0)) {
      annot = xmlSchemaParseAnnotation((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)attr,1);
      xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)annItem,annot);
      attr = attr->next;
    }
    if (type._4_4_ == XML_SCHEMA_TYPE_COMPLEX_CONTENT) {
      if (((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
         ((iVar1 = xmlStrEqual(attr->name,"all"), iVar1 == 0 ||
          (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 == 0)))) {
        if (((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
           ((iVar1 = xmlStrEqual(attr->name,(xmlChar *)"choice"), iVar1 == 0 ||
            (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 == 0)))) {
          if ((((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
              (iVar1 = xmlStrEqual(attr->name,(xmlChar *)"sequence"), iVar1 == 0)) ||
             (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 == 0)) {
            if (((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
               ((iVar1 = xmlStrEqual(attr->name,"group"), iVar1 != 0 &&
                (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 != 0)))) {
              p_Var2 = (_xmlNode *)
                       xmlSchemaParseModelGroupDefRef
                                 ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                  (xmlNodePtr)attr);
              child->prev = p_Var2;
              attr = attr->next;
            }
          }
          else {
            p_Var2 = (_xmlNode *)
                     xmlSchemaParseModelGroup
                               ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                (xmlNodePtr)attr,XML_SCHEMA_TYPE_SEQUENCE,1);
            child->prev = p_Var2;
            attr = attr->next;
          }
        }
        else {
          p_Var2 = (_xmlNode *)
                   xmlSchemaParseModelGroup
                             ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                              (xmlNodePtr)attr,XML_SCHEMA_TYPE_CHOICE,1);
          child->prev = p_Var2;
          attr = attr->next;
        }
      }
      else {
        p_Var2 = (_xmlNode *)
                 xmlSchemaParseModelGroup
                           ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                            (xmlNodePtr)attr,XML_SCHEMA_TYPE_ALL,1);
        child->prev = p_Var2;
        attr = attr->next;
      }
    }
    if (attr != (xmlAttrPtr)0x0) {
      iVar1 = xmlSchemaParseLocalAttributes
                        ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                         (xmlNodePtr *)&attr,(xmlSchemaItemListPtr *)&child[1].nsDef,0xd,(int *)0x0)
      ;
      if (iVar1 == -1) {
        return (xmlSchemaTypePtr)0x0;
      }
      if (((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
         ((iVar1 = xmlStrEqual(attr->name,(xmlChar *)"anyAttribute"), iVar1 != 0 &&
          (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 != 0)))) {
        pxVar3 = xmlSchemaParseAnyAttribute
                           ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                            (xmlNodePtr)attr);
        *(xmlSchemaWildcardPtr *)(schema_local[1].name + 0x98) = pxVar3;
        attr = attr->next;
      }
    }
    if (attr != (xmlAttrPtr)0x0) {
      if (type._4_4_ == XML_SCHEMA_TYPE_COMPLEX_CONTENT) {
        xmlSchemaPContentErr
                  ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                   (xmlSchemaBasicItemPtr)0x0,pxStack_28,(xmlNodePtr)attr,(char *)0x0,
                   "(annotation?, ((group | all | choice | sequence)?, ((attribute | attributeGroup)*, anyAttribute?)))"
                  );
      }
      else {
        xmlSchemaPContentErr
                  ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                   (xmlSchemaBasicItemPtr)0x0,pxStack_28,(xmlNodePtr)attr,(char *)0x0,
                   "(annotation?, ((attribute | attributeGroup)*, anyAttribute?))");
      }
    }
  }
  return (xmlSchemaTypePtr)0x0;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaParseExtension(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                        xmlNodePtr node, xmlSchemaTypeType parentType)
{
    xmlSchemaTypePtr type;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);
    /* Not a component, don't create it. */
    type = ctxt->ctxtType;
    type->flags |= XML_SCHEMAS_TYPE_DERIVATION_METHOD_EXTENSION;

    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "base"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }

    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");

    /*
    * Attribute "base" - mandatory.
    */
    if ((xmlSchemaPValAttrQName(ctxt, schema, NULL, node,
	"base", &(type->baseNs), &(type->base)) == 0) &&
	(type->base == NULL)) {
	xmlSchemaPMissingAttrErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node, "base", NULL);
    }
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	/*
	* Add the annotation to the type ancestor.
	*/
	xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr) type,
	    xmlSchemaParseAnnotation(ctxt, child, 1));
        child = child->next;
    }
    if (parentType == XML_SCHEMA_TYPE_COMPLEX_CONTENT) {
	/*
	* Corresponds to <complexType><complexContent><extension>... and:
	*
	* Model groups <all>, <choice>, <sequence> and <group>.
	*/
	if (IS_SCHEMA(child, "all")) {
	    type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema,
		    child, XML_SCHEMA_TYPE_ALL, 1);
	    child = child->next;
	} else if (IS_SCHEMA(child, "choice")) {
	    type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema,
		    child, XML_SCHEMA_TYPE_CHOICE, 1);
	    child = child->next;
	} else if (IS_SCHEMA(child, "sequence")) {
	    type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema,
		child, XML_SCHEMA_TYPE_SEQUENCE, 1);
	    child = child->next;
	} else if (IS_SCHEMA(child, "group")) {
	    type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroupDefRef(ctxt, schema, child);
	    /*
	    * Note that the reference will be resolved in
	    * xmlSchemaResolveTypeReferences();
	    */
	    child = child->next;
	}
    }
    if (child != NULL) {
	/*
	* Attribute uses/declarations.
	*/
	if (xmlSchemaParseLocalAttributes(ctxt, schema, &child,
	    (xmlSchemaItemListPtr *) &(type->attrUses),
	    XML_SCHEMA_TYPE_EXTENSION, NULL) == -1)
	    return(NULL);
	/*
	* Attribute wildcard.
	*/
	if (IS_SCHEMA(child, "anyAttribute")) {
	    ctxt->ctxtType->attributeWildcard =
		xmlSchemaParseAnyAttribute(ctxt, schema, child);
	    child = child->next;
	}
    }
    if (child != NULL) {
	if (parentType == XML_SCHEMA_TYPE_COMPLEX_CONTENT) {
	    /* Complex content extension. */
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, ((group | all | choice | sequence)?, "
		"((attribute | attributeGroup)*, anyAttribute?)))");
	} else {
	    /* Simple content extension. */
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, ((attribute | attributeGroup)*, "
		"anyAttribute?))");
	}
    }
    return (NULL);
}